

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression_matcher.cpp
# Opt level: O3

bool __thiscall
duckdb::FunctionExpressionMatcher::Match
          (FunctionExpressionMatcher *this,Expression *expr_p,
          vector<std::reference_wrapper<duckdb::Expression>,_true> *bindings)

{
  bool bVar1;
  int iVar2;
  BoundFunctionExpression *pBVar3;
  pointer pFVar4;
  
  bVar1 = ExpressionMatcher::Match(&this->super_ExpressionMatcher,expr_p,bindings);
  if (!bVar1) {
    return false;
  }
  pBVar3 = BaseExpression::Cast<duckdb::BoundFunctionExpression>(&expr_p->super_BaseExpression);
  if ((this->function).
      super_unique_ptr<duckdb::FunctionMatcher,_std::default_delete<duckdb::FunctionMatcher>_>._M_t.
      super___uniq_ptr_impl<duckdb::FunctionMatcher,_std::default_delete<duckdb::FunctionMatcher>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::FunctionMatcher_*,_std::default_delete<duckdb::FunctionMatcher>_>
      .super__Head_base<0UL,_duckdb::FunctionMatcher_*,_false>._M_head_impl !=
      (FunctionMatcher *)0x0) {
    pFVar4 = unique_ptr<duckdb::FunctionMatcher,_std::default_delete<duckdb::FunctionMatcher>,_true>
             ::operator->(&this->function);
    iVar2 = (*pFVar4->_vptr_FunctionMatcher[2])
                      (pFVar4,&(pBVar3->function).super_BaseScalarFunction.super_SimpleFunction.
                               super_Function.name);
    if ((char)iVar2 == '\0') {
      return false;
    }
  }
  bVar1 = SetMatcher::Match<duckdb::Expression,duckdb::ExpressionMatcher>
                    (&this->matchers,&pBVar3->children,bindings,this->policy);
  return bVar1;
}

Assistant:

bool FunctionExpressionMatcher::Match(Expression &expr_p, vector<reference<Expression>> &bindings) {
	if (!ExpressionMatcher::Match(expr_p, bindings)) {
		return false;
	}
	auto &expr = expr_p.Cast<BoundFunctionExpression>();
	if (!FunctionMatcher::Match(function, expr.function.name)) {
		return false;
	}
	if (!SetMatcher::Match(matchers, expr.children, bindings, policy)) {
		return false;
	}
	return true;
}